

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ValueDriver * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::ValueExpressionBase_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
          (BumpAllocator *this,DriverKind *args,ValueExpressionBase *args_1,Symbol *args_2,
          bitmask<slang::ast::AssignFlags> *args_3)

{
  ValueDriver *pVVar1;
  Symbol *in_RCX;
  Expression *in_RDX;
  undefined8 in_RSI;
  DriverKind kind;
  ValueDriver *in_RDI;
  size_t in_R8;
  bitmask<slang::ast::AssignFlags> unaff_retaddr;
  
  kind = (DriverKind)((ulong)in_RSI >> 0x38);
  pVVar1 = (ValueDriver *)allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_R8);
  slang::ast::ValueDriver::ValueDriver(in_RDI,kind,in_RDX,in_RCX,unaff_retaddr);
  return pVVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }